

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::~IfcRoof(IfcRoof *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x20 +
                   lVar2);
  plVar1[-0x2d] = 0x858280;
  plVar1[2] = 0x858398;
  plVar1[-0x1c] = 0x8582a8;
  plVar1[-0x1a] = 0x8582d0;
  plVar1[-0x13] = 0x8582f8;
  plVar1[-0xd] = 0x858320;
  plVar1[-6] = 0x858348;
  plVar1[-4] = 0x858370;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__008583b8);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),400);
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}